

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O1

bool __thiscall re2::DFA::PossibleMatchRange(DFA *this,string *min,string *max,int maxlen)

{
  pointer pcVar1;
  string *this_00;
  bool bVar2;
  int iVar3;
  mapped_type *pmVar4;
  State *pSVar5;
  StringPiece *extraout_RDX;
  StringPiece *extraout_RDX_00;
  StringPiece *prefix;
  bool bVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  State *s;
  RWLocker l;
  map<re2::DFA::State_*,_int,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
  previously_visited_states;
  State *local_120;
  int local_114;
  string *local_110;
  State *local_108;
  pthread_rwlock_t *local_100;
  RWLocker local_f8;
  _Rb_tree<re2::DFA::State_*,_std::pair<re2::DFA::State_*const,_int>,_std::_Select1st<std::pair<re2::DFA::State_*const,_int>_>,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
  local_e8;
  string local_b8;
  pointer local_98;
  undefined4 local_90;
  SearchParams local_88;
  
  if (this->init_failed_ != false) {
    return false;
  }
  local_e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_e8._M_impl.super__Rb_tree_header._M_header;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f8.mu_ = &this->cache_mutex_;
  local_f8.writing_ = false;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_e8._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar3 = pthread_rwlock_rdlock((pthread_rwlock_t *)local_f8.mu_);
  if (iVar3 != 0) goto LAB_00130d50;
  local_88.text.ptr_ = (char *)0x0;
  local_88.text.length_ = 0;
  local_88.context.ptr_ = (char *)0x0;
  local_88.context.length_ = 0;
  local_88.run_forward = false;
  local_88.start = (State *)0x0;
  local_88.firstbyte = -1;
  local_88.cache_lock = &local_f8;
  local_88.failed = false;
  local_88.ep = (char *)0x0;
  local_88.matches = (vector<int,_std::allocator<int>_> *)0x0;
  local_88.anchored = true;
  local_88.want_earliest_match = false;
  bVar2 = AnalyzeSearch(this,&local_88);
  pSVar5 = local_88.start;
  if ((!bVar2) || (local_88.start == (State *)0x2)) {
    bVar2 = false;
    goto LAB_00130a12;
  }
  if (local_88.start == (State *)0x1) {
    std::__cxx11::string::_M_replace((ulong)min,0,(char *)min->_M_string_length,0x146246);
    bVar2 = true;
    std::__cxx11::string::_M_replace((ulong)max,0,(char *)max->_M_string_length,0x146246);
    goto LAB_00130a12;
  }
  local_120 = local_88.start;
  min->_M_string_length = 0;
  *(min->_M_dataplus)._M_p = '\0';
  local_100 = (pthread_rwlock_t *)&this->mutex_;
  iVar3 = pthread_rwlock_wrlock(local_100);
  if (iVar3 != 0) goto LAB_00130d50;
  local_114 = maxlen;
  local_110 = max;
  if (maxlen < 1) {
LAB_00130b79:
    std::
    _Rb_tree<re2::DFA::State_*,_std::pair<re2::DFA::State_*const,_int>,_std::_Select1st<std::pair<re2::DFA::State_*const,_int>_>,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
    ::clear(&local_e8);
    max->_M_string_length = 0;
    pcVar1 = (max->_M_dataplus)._M_p;
    *pcVar1 = '\0';
    local_108 = (State *)CONCAT44(local_108._4_4_,(int)CONCAT71((int7)((ulong)pcVar1 >> 8),1));
    iVar3 = 0;
    local_120 = pSVar5;
    if (maxlen < 1) {
      bVar2 = false;
      prefix = extraout_RDX;
    }
    else {
      bVar2 = false;
      do {
        pmVar4 = std::
                 map<re2::DFA::State_*,_int,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
                 ::operator[]((map<re2::DFA::State_*,_int,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
                               *)&local_e8,&local_120);
        prefix = extraout_RDX_00;
        if (0 < *pmVar4) break;
        pmVar4 = std::
                 map<re2::DFA::State_*,_int,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
                 ::operator[]((map<re2::DFA::State_*,_int,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
                               *)&local_e8,&local_120);
        *pmVar4 = *pmVar4 + 1;
        iVar7 = 0xff;
        bVar6 = false;
        do {
          pSVar5 = RunStateOnByte(this,local_120,iVar7);
          if (pSVar5 == (State *)0x0) {
            iVar8 = 1;
            bVar9 = false;
            bVar2 = false;
          }
          else {
            if (pSVar5 != (State *)0x2) {
              iVar8 = 0;
              bVar9 = true;
              if ((pSVar5 < (State *)0x3) || (pSVar5->ninst_ < 1)) goto LAB_00130c44;
            }
            std::__cxx11::string::_M_replace_aux
                      ((ulong)local_110,local_110->_M_string_length,0,'\x01');
            bVar6 = true;
            iVar8 = 0xb;
            bVar9 = false;
            local_120 = pSVar5;
          }
LAB_00130c44:
          if (!bVar9) goto LAB_00130c53;
          bVar9 = iVar7 != 0;
          iVar7 = iVar7 + -1;
        } while (bVar9);
        iVar8 = 0xb;
LAB_00130c53:
        bVar9 = iVar8 == 0;
        if (iVar8 == 0xb) {
          bVar9 = bVar6;
        }
        prefix = (StringPiece *)(ulong)bVar9;
        bVar2 = (bool)(iVar8 == 0xb & (bVar6 ^ 1U) | bVar2);
        if (bVar9 == false) {
          local_108 = (State *)((ulong)local_108 & 0xffffffff00000000);
          break;
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 != local_114);
    }
    this_00 = local_110;
    if ((char)local_108 != '\0') {
      local_98 = (local_110->_M_dataplus)._M_p;
      local_90 = (undefined4)local_110->_M_string_length;
      PrefixSuccessor_abi_cxx11_(&local_b8,(re2 *)&local_98,prefix);
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      bVar2 = local_110->_M_string_length != 0;
    }
  }
  else {
    local_108 = pSVar5;
    iVar3 = 0;
    do {
      pmVar4 = std::
               map<re2::DFA::State_*,_int,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
               ::operator[]((map<re2::DFA::State_*,_int,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
                             *)&local_e8,&local_120);
      iVar7 = 2;
      if (0 < *pmVar4) break;
      pmVar4 = std::
               map<re2::DFA::State_*,_int,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
               ::operator[]((map<re2::DFA::State_*,_int,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
                             *)&local_e8,&local_120);
      *pmVar4 = *pmVar4 + 1;
      pSVar5 = RunStateOnByte(this,local_120,0x100);
      iVar7 = 1;
      if (pSVar5 == (State *)0x0) {
LAB_00130b28:
        bVar2 = false;
      }
      else {
        if ((pSVar5 != (State *)0x1) &&
           ((pSVar5 == (State *)0x2 || ((pSVar5->flag_ & 0x1000) != 0)))) {
          iVar7 = 2;
          goto LAB_00130b28;
        }
        iVar8 = 0;
        do {
          pSVar5 = RunStateOnByte(this,local_120,iVar8);
          if (pSVar5 == (State *)0x0) goto LAB_00130b1f;
          if ((pSVar5 == (State *)0x2) || (((State *)0x2 < pSVar5 && (0 < pSVar5->ninst_)))) {
            std::__cxx11::string::_M_replace_aux((ulong)min,min->_M_string_length,0,'\x01');
            iVar7 = 0;
            bVar2 = true;
            max = local_110;
            maxlen = local_114;
            local_120 = pSVar5;
            goto LAB_00130b57;
          }
          iVar8 = iVar8 + 1;
        } while (iVar8 != 0x100);
        iVar7 = 2;
LAB_00130b1f:
        bVar2 = false;
        max = local_110;
        maxlen = local_114;
      }
LAB_00130b57:
      if (!bVar2) break;
      iVar3 = iVar3 + 1;
      iVar7 = 2;
    } while (iVar3 != maxlen);
    pSVar5 = local_108;
    if (iVar7 == 2) goto LAB_00130b79;
    bVar2 = false;
  }
  iVar3 = pthread_rwlock_unlock(local_100);
  if (iVar3 == 0) {
LAB_00130a12:
    RWLocker::~RWLocker(&local_f8);
    std::
    _Rb_tree<re2::DFA::State_*,_std::pair<re2::DFA::State_*const,_int>,_std::_Select1st<std::pair<re2::DFA::State_*const,_int>_>,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
    ::~_Rb_tree(&local_e8);
    return bVar2;
  }
LAB_00130d50:
  abort();
}

Assistant:

bool DFA::PossibleMatchRange(string* min, string* max, int maxlen) {
  if (!ok())
    return false;

  // NOTE: if future users of PossibleMatchRange want more precision when
  // presented with infinitely repeated elements, consider making this a
  // parameter to PossibleMatchRange.
  static int kMaxEltRepetitions = 0;

  // Keep track of the number of times we've visited states previously. We only
  // revisit a given state if it's part of a repeated group, so if the value
  // portion of the map tuple exceeds kMaxEltRepetitions we bail out and set
  // |*max| to |PrefixSuccessor(*max)|.
  //
  // Also note that previously_visited_states[UnseenStatePtr] will, in the STL
  // tradition, implicitly insert a '0' value at first use. We take advantage
  // of that property below.
  map<State*, int> previously_visited_states;

  // Pick out start state for anchored search at beginning of text.
  RWLocker l(&cache_mutex_);
  SearchParams params(NULL, NULL, &l);
  params.anchored = true;
  if (!AnalyzeSearch(&params))
    return false;
  if (params.start == DeadState) {  // No matching strings
    *min = "";
    *max = "";
    return true;
  }
  if (params.start == FullMatchState)  // Every string matches: no max
    return false;

  // The DFA is essentially a big graph rooted at params.start,
  // and paths in the graph correspond to accepted strings.
  // Each node in the graph has potentially 256+1 arrows
  // coming out, one for each byte plus the magic end of
  // text character kByteEndText.

  // To find the smallest possible prefix of an accepted
  // string, we just walk the graph preferring to follow
  // arrows with the lowest bytes possible.  To find the
  // largest possible prefix, we follow the largest bytes
  // possible.

  // The test for whether there is an arrow from s on byte j is
  //    ns = RunStateOnByteUnlocked(s, j);
  //    if (ns == NULL)
  //      return false;
  //    if (ns != DeadState && ns->ninst > 0)
  // The RunStateOnByteUnlocked call asks the DFA to build out the graph.
  // It returns NULL only if the DFA has run out of memory,
  // in which case we can't be sure of anything.
  // The second check sees whether there was graph built
  // and whether it is interesting graph.  Nodes might have
  // ns->ninst == 0 if they exist only to represent the fact
  // that a match was found on the previous byte.

  // Build minimum prefix.
  State* s = params.start;
  min->clear();
  MutexLock lock(&mutex_);
  for (int i = 0; i < maxlen; i++) {
    if (previously_visited_states[s] > kMaxEltRepetitions) {
      VLOG(2) << "Hit kMaxEltRepetitions=" << kMaxEltRepetitions
        << " for state s=" << s << " and min=" << CEscape(*min);
      break;
    }
    previously_visited_states[s]++;

    // Stop if min is a match.
    State* ns = RunStateOnByte(s, kByteEndText);
    if (ns == NULL)  // DFA out of memory
      return false;
    if (ns != DeadState && (ns == FullMatchState || ns->IsMatch()))
      break;

    // Try to extend the string with low bytes.
    bool extended = false;
    for (int j = 0; j < 256; j++) {
      ns = RunStateOnByte(s, j);
      if (ns == NULL)  // DFA out of memory
        return false;
      if (ns == FullMatchState ||
          (ns > SpecialStateMax && ns->ninst_ > 0)) {
        extended = true;
        min->append(1, static_cast<char>(j));
        s = ns;
        break;
      }
    }
    if (!extended)
      break;
  }

  // Build maximum prefix.
  previously_visited_states.clear();
  s = params.start;
  max->clear();
  for (int i = 0; i < maxlen; i++) {
    if (previously_visited_states[s] > kMaxEltRepetitions) {
      VLOG(2) << "Hit kMaxEltRepetitions=" << kMaxEltRepetitions
        << " for state s=" << s << " and max=" << CEscape(*max);
      break;
    }
    previously_visited_states[s] += 1;

    // Try to extend the string with high bytes.
    bool extended = false;
    for (int j = 255; j >= 0; j--) {
      State* ns = RunStateOnByte(s, j);
      if (ns == NULL)
        return false;
      if (ns == FullMatchState ||
          (ns > SpecialStateMax && ns->ninst_ > 0)) {
        extended = true;
        max->append(1, static_cast<char>(j));
        s = ns;
        break;
      }
    }
    if (!extended) {
      // Done, no need for PrefixSuccessor.
      return true;
    }
  }

  // Stopped while still adding to *max - round aaaaaaaaaa... to aaaa...b
  *max = PrefixSuccessor(*max);

  // If there are no bytes left, we have no way to say "there is no maximum
  // string".  We could make the interface more complicated and be able to
  // return "there is no maximum but here is a minimum", but that seems like
  // overkill -- the most common no-max case is all possible strings, so not
  // telling the caller that the empty string is the minimum match isn't a
  // great loss.
  if (max->empty())
    return false;

  return true;
}